

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O1

void Bac_NtkCollapse_rec(Bac_Ntk_t *pNew,Bac_Ntk_t *p,Vec_Int_t *vSigs)

{
  Vec_Int_t *p_00;
  byte bVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  Bac_Ntk_t *p_01;
  long lVar13;
  long local_40;
  
  iVar5 = (p->vType).nCap;
  lVar10 = (long)iVar5;
  if (lVar10 == 0) {
    __assert_fail("Bac_NtkObjNumAlloc(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                  ,0xfe,"void Bac_NtkStartCopies(Bac_Ntk_t *)");
  }
  p_00 = &p->vCopy;
  if ((p->vCopy).nCap < iVar5) {
    piVar8 = (p->vCopy).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc(lVar10 * 4);
    }
    else {
      piVar8 = (int *)realloc(piVar8,lVar10 * 4);
    }
    (p->vCopy).pArray = piVar8;
    if (piVar8 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_00->nCap = iVar5;
  }
  if (0 < iVar5) {
    memset((p->vCopy).pArray,0xff,lVar10 << 2);
  }
  (p->vCopy).nSize = iVar5;
  if (vSigs->nSize != (p->vInputs).nSize) {
    __assert_fail("Vec_IntSize(vSigs) == Bac_NtkPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                  ,0x210,"void Bac_NtkCollapse_rec(Bac_Ntk_t *, Bac_Ntk_t *, Vec_Int_t *)");
  }
  if (0 < (p->vInputs).nSize) {
    lVar10 = 0;
    do {
      if (vSigs->nSize <= lVar10) goto LAB_0038c72c;
      uVar7 = (p->vInputs).pArray[lVar10];
      if (((int)uVar7 < 0) || ((p->vCopy).nSize <= (int)uVar7)) goto LAB_0038c72c;
      if ((p->vCopy).pArray[uVar7] != -1) {
LAB_0038c7a8:
        __assert_fail("Bac_ObjCopy(p, i) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                      ,0x12d,"void Bac_ObjSetCopy(Bac_Ntk_t *, int, int)");
      }
      Vec_IntSetEntry(p_00,uVar7,vSigs->pArray[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 < (p->vInputs).nSize);
  }
  uVar7 = (p->vType).nSize;
  uVar9 = (ulong)uVar7;
  if (0 < (int)uVar7) {
    lVar10 = 1;
    lVar13 = 0;
    do {
      pcVar3 = (p->vType).pArray;
      bVar1 = pcVar3[lVar13];
      uVar7 = (uint)(bVar1 >> 1);
      if (uVar7 - 5 < 0x44) {
        if ((bVar1 & 0xfe) == 10) {
          lVar12 = lVar10;
          if (lVar13 + 1 < (long)(p->vType).nSize) {
            do {
              if (((p->vType).pArray[lVar12] & 0xfeU) != 8) break;
              Bac_ObjAlloc(pNew,BAC_OBJ_BI,-1);
              Bac_ObjAlloc(pNew,BAC_BOX_BUF,-1);
              iVar5 = Bac_ObjAlloc(pNew,BAC_OBJ_BO,-1);
              if ((p->vCopy).nSize <= lVar12) goto LAB_0038c72c;
              if ((p->vCopy).pArray[lVar12] != -1) goto LAB_0038c7a8;
              Vec_IntSetEntry(p_00,(int)lVar12,iVar5);
              lVar12 = lVar12 + 1;
            } while ((int)lVar12 < (p->vType).nSize);
          }
        }
        else {
          if (uVar7 - 0x49 < 0xffffffbc) {
            __assert_fail("Bac_ObjIsBox(p, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                          ,0x130,"int Bac_BoxBiNum(Bac_Ntk_t *, int)");
          }
          lVar12 = lVar13;
          do {
            if (lVar12 < 1) {
              uVar7 = 0;
              goto LAB_0038c19e;
            }
            if ((int)uVar9 < lVar13) goto LAB_0038c74b;
            lVar11 = lVar12 + -1;
            lVar12 = lVar12 + -1;
          } while ((pcVar3[lVar11] & 0xfeU) == 6);
          uVar7 = (int)lVar12 + 1;
LAB_0038c19e:
          if (((int)uVar7 < 0) || ((p->vType).nSize <= (int)uVar7)) goto LAB_0038c74b;
          uVar9 = (ulong)uVar7;
          while (((p->vType).pArray[uVar9] & 0xfeU) == 6) {
            Bac_ObjDup(pNew,p,(int)uVar9);
            uVar9 = uVar9 + 1;
            if ((p->vType).nSize <= (int)uVar9) goto LAB_0038c74b;
          }
          iVar5 = (int)lVar13;
          uVar7 = Bac_ObjDup(pNew,p,iVar5);
          if ((((p->vName).pArray != (int *)0x0) && ((pNew->vName).pArray != (int *)0x0)) &&
             (iVar6 = Bac_ObjName(p,iVar5), iVar6 != 0)) {
            iVar5 = Bac_ObjName(p,iVar5);
            iVar6 = Bac_ObjName(pNew,uVar7);
            if (iVar6 != 0) {
LAB_0038c862:
              __assert_fail("Bac_ObjName(p, i) == 0 && !Bac_ObjIsCo(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                            ,300,"void Bac_ObjSetName(Bac_Ntk_t *, int, int)");
            }
            if (((int)uVar7 < 0) || ((pNew->vType).nSize <= (int)uVar7)) goto LAB_0038c74b;
            if (((pNew->vType).pArray[uVar7] & 0xfcU) == 4) goto LAB_0038c862;
            Vec_IntSetEntry(&pNew->vName,uVar7,iVar5);
          }
          if ((p->vType).nSize <= lVar13) goto LAB_0038c74b;
          if (((byte)(p->vType).pArray[lVar13] >> 1) - 0x49 < 0xffffffbc) goto LAB_0038c7c7;
          if ((p->vFanin).nSize <= lVar13) goto LAB_0038c72c;
          iVar5 = (p->vFanin).pArray[lVar13];
          if ((0 < (long)iVar5) && (iVar5 <= p->pDesign->nNtks)) {
            if (((int)uVar7 < 0) || ((pNew->vType).nSize <= (int)uVar7)) goto LAB_0038c74b;
            iVar5 = p->pDesign->pNtks[iVar5].iCopy;
            if (((iVar5 < 1) || (0x43 < ((byte)(pNew->vType).pArray[uVar7] >> 1) - 5)) ||
               (pNew->pDesign->nNtks < iVar5)) {
              __assert_fail("Bac_ObjIsBox(p, i)&&Bac_ManNtkIsOk(p->pDesign, x)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                            ,0x13e,"void Bac_BoxSetNtkId(Bac_Ntk_t *, int, int)");
            }
            Vec_IntSetEntry(&pNew->vFanin,uVar7,iVar5);
          }
          lVar12 = lVar13;
          if (lVar13 + 1 < (long)(p->vType).nSize) {
            do {
              iVar5 = (int)lVar12;
              if (iVar5 < -1) goto LAB_0038c74b;
              if (((p->vType).pArray[lVar12 + 1] & 0xfeU) != 8) break;
              Bac_ObjDup(pNew,p,(int)(lVar12 + 1));
              lVar12 = lVar12 + 1;
            } while (iVar5 + 2 < (p->vType).nSize);
          }
        }
      }
      lVar13 = lVar13 + 1;
      uVar9 = (ulong)(p->vType).nSize;
      lVar10 = lVar10 + 1;
    } while (lVar13 < (long)uVar9);
  }
  if (0 < (p->vType).nSize) {
    iVar5 = 1;
    lVar10 = 4;
    local_40 = 0;
    lVar13 = 1;
    lVar12 = 0;
    do {
      bVar1 = (p->vType).pArray[lVar12];
      if ((bVar1 >> 1) - 5 < 0x44) {
        if ((bVar1 & 0xfe) == 10) {
          vSigs->nSize = 0;
          lVar11 = lVar13;
          if (lVar12 != 0) {
            do {
              if ((p->vType).nSize < (int)lVar11 + -1) goto LAB_0038c74b;
              uVar9 = lVar11 - 2U & 0xffffffff;
              if (((p->vType).pArray[uVar9] & 0xfeU) != 6) break;
              if ((p->vFanin).nSize < (int)lVar11 + -1) goto LAB_0038c72c;
              iVar6 = (p->vFanin).pArray[uVar9];
              if (((long)iVar6 < 0) || ((p->vCopy).nSize <= iVar6)) goto LAB_0038c72c;
              Vec_IntPush(vSigs,(p->vCopy).pArray[iVar6]);
              lVar11 = lVar11 + -1;
            } while (1 < lVar11);
          }
          if ((p->vType).nSize <= lVar12) goto LAB_0038c74b;
          if (((byte)(p->vType).pArray[lVar12] >> 1) - 0x49 < 0xffffffbc) {
LAB_0038c7c7:
            __assert_fail("Bac_ObjIsBox(p, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                          ,0x13d,"int Bac_BoxNtkId(Bac_Ntk_t *, int)");
          }
          if ((p->vFanin).nSize <= lVar12) goto LAB_0038c72c;
          iVar6 = (p->vFanin).pArray[lVar12];
          if (((long)iVar6 < 1) || (p->pDesign->nNtks < iVar6)) {
            p_01 = (Bac_Ntk_t *)0x0;
          }
          else {
            p_01 = p->pDesign->pNtks + iVar6;
          }
          Bac_NtkCollapse_rec(pNew,p_01,vSigs);
          iVar6 = (p->vType).nSize;
          if (iVar6 <= lVar12) goto LAB_0038c74b;
          pcVar3 = (p->vType).pArray;
          if (((byte)pcVar3[lVar12] >> 1) - 0x49 < 0xffffffbc) {
            __assert_fail("Bac_ObjIsBox(p, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                          ,0x131,"int Bac_BoxBoNum(Bac_Ntk_t *, int)");
          }
          uVar7 = iVar6 - 1;
          lVar11 = 0;
          do {
            if (local_40 + (ulong)uVar7 == lVar11) goto LAB_0038c5b4;
            lVar4 = lVar11 + lVar13;
            lVar11 = lVar11 + 1;
          } while ((pcVar3[lVar4] & 0xfeU) == 8);
          uVar7 = (int)lVar11 - iVar5;
LAB_0038c5b4:
          if (vSigs->nSize != uVar7 - (int)lVar12) {
            __assert_fail("Vec_IntSize(vSigs) == Bac_BoxBoNum(p, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                          ,0x22e,"void Bac_NtkCollapse_rec(Bac_Ntk_t *, Bac_Ntk_t *, Vec_Int_t *)");
          }
          if (lVar12 + 1 < (long)(p->vType).nSize) {
            lVar11 = 0;
            do {
              if (((p->vType).pArray[lVar13 + lVar11] & 0xfeU) != 8) break;
              if (((long)(p->vCopy).nSize <= lVar13 + lVar11) || (vSigs->nSize <= lVar11))
              goto LAB_0038c72c;
              iVar6 = *(int *)((long)(p->vCopy).pArray + lVar11 * 4 + lVar10);
              if (iVar6 < 2) goto LAB_0038c74b;
              uVar7 = iVar6 - 2;
              if ((pNew->vType).nSize <= (int)uVar7) goto LAB_0038c74b;
              if (((pNew->vType).pArray[uVar7] & 0xfcU) != 4) goto LAB_0038c76a;
              if ((pNew->vFanin).nSize <= (int)uVar7) goto LAB_0038c72c;
              if ((pNew->vFanin).pArray[uVar7] != -1) {
LAB_0038c789:
                __assert_fail("Bac_ObjFanin(p, i) == -1 && Bac_ObjIsCo(p, i)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                              ,0x12a,"void Bac_ObjSetFanin(Bac_Ntk_t *, int, int)");
              }
              Vec_IntSetEntry(&pNew->vFanin,uVar7,vSigs->pArray[lVar11]);
              lVar11 = lVar11 + 1;
            } while ((int)lVar11 + (int)lVar13 < (p->vType).nSize);
          }
        }
        else {
          lVar11 = lVar13;
          if (lVar12 != 0) {
            do {
              iVar6 = (int)lVar11;
              if ((p->vType).nSize < iVar6 + -1) goto LAB_0038c74b;
              uVar9 = lVar11 - 2U & 0xffffffff;
              if (((p->vType).pArray[uVar9] & 0xfeU) != 6) break;
              iVar2 = (p->vCopy).nSize;
              if ((iVar2 < iVar6 + -1) || ((p->vFanin).nSize < iVar6 + -1)) goto LAB_0038c72c;
              iVar6 = (p->vFanin).pArray[uVar9];
              if (((long)iVar6 < 0) || (iVar2 <= iVar6)) goto LAB_0038c72c;
              piVar8 = (p->vCopy).pArray;
              uVar7 = piVar8[uVar9];
              if (((int)uVar7 < 0) || ((pNew->vType).nSize <= (int)uVar7)) goto LAB_0038c74b;
              if (((pNew->vType).pArray[uVar7] & 0xfcU) != 4) goto LAB_0038c76a;
              if ((pNew->vFanin).nSize <= (int)uVar7) goto LAB_0038c72c;
              if ((pNew->vFanin).pArray[uVar7] != -1) goto LAB_0038c789;
              Vec_IntSetEntry(&pNew->vFanin,uVar7,piVar8[iVar6]);
              lVar11 = lVar11 + -1;
            } while (1 < lVar11);
          }
        }
      }
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + 1;
      iVar5 = iVar5 + -1;
      local_40 = local_40 + -1;
      lVar10 = lVar10 + 4;
    } while (lVar12 < (p->vType).nSize);
  }
  vSigs->nSize = 0;
  if (0 < (p->vOutputs).nSize) {
    lVar10 = 0;
    do {
      iVar5 = (p->vOutputs).pArray[lVar10];
      lVar13 = (long)iVar5;
      if ((lVar13 < 0) || ((p->vType).nSize <= iVar5)) {
LAB_0038c74b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if (((p->vType).pArray[lVar13] & 0xfcU) != 4) {
LAB_0038c76a:
        __assert_fail("Bac_ObjIsCo(p, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                      ,0x11d,"int Bac_ObjFanin(Bac_Ntk_t *, int)");
      }
      if ((p->vFanin).nSize <= iVar5) {
LAB_0038c72c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = (p->vFanin).pArray[lVar13];
      if (((long)iVar5 < 0) || ((p->vCopy).nSize <= iVar5)) goto LAB_0038c72c;
      Vec_IntPush(vSigs,(p->vCopy).pArray[iVar5]);
      lVar10 = lVar10 + 1;
    } while (lVar10 < (p->vOutputs).nSize);
  }
  return;
}

Assistant:

void Bac_NtkCollapse_rec( Bac_Ntk_t * pNew, Bac_Ntk_t * p, Vec_Int_t * vSigs )
{
    int i, iObj, iObjNew, iTerm;
    Bac_NtkStartCopies( p );
    // set PI copies
    assert( Vec_IntSize(vSigs) == Bac_NtkPiNum(p) );
    Bac_NtkForEachPi( p, iObj, i )
        Bac_ObjSetCopy( p, iObj, Vec_IntEntry(vSigs, i) );
    // duplicate internal objects and create buffers for hierarchy instances
    Bac_NtkForEachBox( p, iObj )
        if ( Bac_ObjIsBoxPrim( p, iObj ) )
            Bac_BoxDup( pNew, p, iObj );
        else
        {
            Bac_BoxForEachBo( p, iObj, iTerm, i )
            {
                iObjNew = Bac_ObjAlloc( pNew, BAC_OBJ_BI,  -1 );
                iObjNew = Bac_ObjAlloc( pNew, BAC_BOX_BUF, -1 ); // buffer
                iObjNew = Bac_ObjAlloc( pNew, BAC_OBJ_BO,  -1 );
                Bac_ObjSetCopy( p, iTerm, iObjNew );
            }
        }
    // duplicate user modules and connect objects
    Bac_NtkForEachBox( p, iObj )
        if ( Bac_ObjIsBoxPrim( p, iObj ) )
        {
            Bac_BoxForEachBi( p, iObj, iTerm, i )
                Bac_ObjSetFanin( pNew, Bac_ObjCopy(p, iTerm), Bac_ObjCopy(p, Bac_ObjFanin(p, iTerm)) );
        }
        else
        {
            Vec_IntClear( vSigs );
            Bac_BoxForEachBi( p, iObj, iTerm, i )
                Vec_IntPush( vSigs, Bac_ObjCopy(p, Bac_ObjFanin(p, iTerm)) );
            Bac_NtkCollapse_rec( pNew, Bac_BoxNtk(p, iObj), vSigs );
            assert( Vec_IntSize(vSigs) == Bac_BoxBoNum(p, iObj) );
            Bac_BoxForEachBo( p, iObj, iTerm, i )
                Bac_ObjSetFanin( pNew, Bac_ObjCopy(p, iTerm)-2, Vec_IntEntry(vSigs, i) );
        }
    // collect POs
    Vec_IntClear( vSigs );
    Bac_NtkForEachPo( p, iObj, i )
        Vec_IntPush( vSigs, Bac_ObjCopy(p, Bac_ObjFanin(p, iObj)) );
}